

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-impl.cpp
# Opt level: O2

void __thiscall
yactfr::internal::SetKeyDtsDtVisitor::_visitVarType<yactfr::VariantWithUnsignedIntegerSelectorType>
          (SetKeyDtsDtVisitor *this,VariantWithUnsignedIntegerSelectorType *varType)

{
  uint uVar1;
  mapped_type *pmVar2;
  socklen_t *in_RCX;
  sockaddr *__addr;
  ulong uVar3;
  key_type local_30;
  
  _setKeyDts(this,&(varType->super_VariantWithIntegerSelectorType<unsigned_long_long>).
                   super_VariantType._selLoc,
             &(varType->super_VariantWithIntegerSelectorType<unsigned_long_long>).super_VariantType.
              _theSelTypes);
  for (uVar1 = 0; uVar3 = (ulong)uVar1, local_30 = (key_type)varType,
      uVar3 < (ulong)((long)(varType->super_VariantWithIntegerSelectorType<unsigned_long_long>).
                            _opts.
                            super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(varType->super_VariantWithIntegerSelectorType<unsigned_long_long>).
                            _opts.
                            super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar1 = uVar1 + 1) {
    pmVar2 = std::__detail::
             _Map_base<const_yactfr::DataType_*,_std::pair<const_yactfr::DataType_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::DataType_*>,_std::hash<const_yactfr::DataType_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_yactfr::DataType_*,_std::pair<const_yactfr::DataType_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::DataType_*>,_std::hash<const_yactfr::DataType_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->_current,&local_30);
    *pmVar2 = uVar3;
    DataType::accept(*(DataType **)
                      ((long)(varType->super_VariantWithIntegerSelectorType<unsigned_long_long>).
                             _opts.
                             super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar3]._M_t.
                             super___uniq_ptr_impl<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
                             ._M_t + 0x50),(int)this,__addr,in_RCX);
  }
  std::
  _Hashtable<const_yactfr::DataType_*,_std::pair<const_yactfr::DataType_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::DataType_*>,_std::hash<const_yactfr::DataType_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->_current)._M_h);
  return;
}

Assistant:

void _visitVarType(const VarTypeT& varType)
    {
        this->_setKeyDts(varType.selectorLocation(), TraceTypeImpl::varOptTypeSelTypes(varType));

        for (auto i = 0U; i < varType.size(); ++i) {
            // currently being visited
            _current[&varType] = i;

            varType[i].dataType().accept(*this);
        }

        // not visited anymore
        _current.erase(&varType);
    }